

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O1

size_t doctest::detail::my_strlen(char *in)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *temp;
  
  pcVar2 = in;
  if (in != (char *)0x0) {
    pcVar3 = in + -1;
    do {
      pcVar2 = pcVar3 + 1;
      pcVar1 = pcVar3 + 1;
      pcVar3 = pcVar2;
    } while (*pcVar1 != '\0');
  }
  return (long)pcVar2 - (long)in;
}

Assistant:

size_t my_strlen(const char* in) {
        const char* temp = in;
        while(temp && *temp)
            ++temp;
        return temp - in;
    }